

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundCaseExpression *expr,ExpressionState *state_p,
          SelectionVector *sel,idx_t count,Vector *result)

{
  DataChunk *this_00;
  ExpressionState *true_sel;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> state;
  uint uVar1;
  const_reference this_01;
  reference pvVar2;
  reference pvVar3;
  type pEVar4;
  idx_t count_00;
  _Head_base<0UL,_duckdb::ExpressionState_*,_false> state_00;
  unsigned_long uVar5;
  unsigned_long count_01;
  size_type __n;
  size_type __n_00;
  SelectionVector *local_98;
  
  this_00 = &state_p->intermediate_chunk;
  DataChunk::Reset(this_00);
  count_01 = count;
  local_98 = sel;
  if ((expr->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (expr->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_start) {
    true_sel = state_p + 1;
    __n_00 = 1;
    __n = 0;
    do {
      this_01 = vector<duckdb::BoundCaseCheck,_true>::operator[](&expr->case_checks,__n);
      pvVar2 = vector<duckdb::Vector,_true>::operator[](&this_00->data,__n_00);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state_p->child_states,__n_00 - 1);
      state._M_head_impl =
           (pvVar3->
           super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
           .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::operator[](&state_p->child_states,__n_00);
      state_00._M_head_impl =
           (pvVar3->
           super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
           .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this_01->when_expr);
      count_00 = Select(this,pEVar4,state._M_head_impl,local_98,count_01,(SelectionVector *)true_sel
                        ,(SelectionVector *)&state_p[1].child_states);
      if (count_00 != 0) {
        uVar5 = count_01 - count_00;
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&this_01->then_expr);
        if (count_01 == count && uVar5 == 0) goto LAB_01420cfc;
        Execute(this,pEVar4,state_00._M_head_impl,(SelectionVector *)true_sel,count_00,pvVar2);
        uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count_00);
        FillSwitch(this,pvVar2,result,(SelectionVector *)true_sel,uVar1);
        count_01 = uVar5;
        local_98 = (SelectionVector *)&state_p[1].child_states;
        if (uVar5 == 0) goto joined_r0x01420cd0;
      }
      __n = __n + 1;
      __n_00 = __n_00 + 2;
    } while (__n < (ulong)((long)(expr->case_checks).
                                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                 .
                                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expr->case_checks).
                                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                 .
                                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (count_01 != 0) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::back(&state_p->child_states);
    state_00._M_head_impl =
         (pvVar3->
         super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
         .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl;
    if (count_01 == count) {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&expr->else_expr);
LAB_01420cfc:
      Execute(this,pEVar4,state_00._M_head_impl,sel,count,result);
      return;
    }
    pvVar2 = vector<duckdb::Vector,_true>::operator[]
                       (&this_00->data,
                        (long)(expr->case_checks).
                              super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                              .
                              super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(expr->case_checks).
                              super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                              .
                              super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&expr->else_expr);
    Execute(this,pEVar4,state_00._M_head_impl,local_98,count_01,pvVar2);
    uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count_01);
    FillSwitch(this,pvVar2,result,local_98,uVar1);
  }
joined_r0x01420cd0:
  if (sel == (SelectionVector *)0x0) {
    return;
  }
  Vector::Slice(result,sel,count);
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundCaseExpression &expr, ExpressionState *state_p, const SelectionVector *sel,
                                 idx_t count, Vector &result) {
	auto &state = state_p->Cast<CaseExpressionState>();

	state.intermediate_chunk.Reset();

	// first execute the check expression
	auto current_true_sel = &state.true_sel;
	auto current_false_sel = &state.false_sel;
	auto current_sel = sel;
	idx_t current_count = count;
	for (idx_t i = 0; i < expr.case_checks.size(); i++) {
		auto &case_check = expr.case_checks[i];
		auto &intermediate_result = state.intermediate_chunk.data[i * 2 + 1];
		auto check_state = state.child_states[i * 2].get();
		auto then_state = state.child_states[i * 2 + 1].get();

		idx_t tcount =
		    Select(*case_check.when_expr, check_state, current_sel, current_count, current_true_sel, current_false_sel);
		if (tcount == 0) {
			// everything is false: do nothing
			continue;
		}
		idx_t fcount = current_count - tcount;
		if (fcount == 0 && current_count == count) {
			// everything is true in the first CHECK statement
			// we can skip the entire case and only execute the TRUE side
			Execute(*case_check.then_expr, then_state, sel, count, result);
			return;
		} else {
			// we need to execute and then fill in the desired tuples in the result
			Execute(*case_check.then_expr, then_state, current_true_sel, tcount, intermediate_result);
			FillSwitch(intermediate_result, result, *current_true_sel, NumericCast<sel_t>(tcount));
		}
		// continue with the false tuples
		current_sel = current_false_sel;
		current_count = fcount;
		if (fcount == 0) {
			// everything is true: we are done
			break;
		}
	}
	if (current_count > 0) {
		auto else_state = state.child_states.back().get();
		if (current_count == count) {
			// everything was false, we can just evaluate the else expression directly
			Execute(*expr.else_expr, else_state, sel, count, result);
			return;
		} else {
			auto &intermediate_result = state.intermediate_chunk.data[expr.case_checks.size() * 2];

			D_ASSERT(current_sel);
			Execute(*expr.else_expr, else_state, current_sel, current_count, intermediate_result);
			FillSwitch(intermediate_result, result, *current_sel, NumericCast<sel_t>(current_count));
		}
	}
	if (sel) {
		result.Slice(*sel, count);
	}
}